

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

missing_req_arg * __thiscall
boost::runtime::specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error>::
operator<<(missing_req_arg *__return_storage_ptr__,
          specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  string local_40;
  
  unit_test::utils::string_cast<std::__cxx11::string>(&local_40,(utils *)val,val);
  std::__cxx11::string::append((string *)(this + 0x18));
  std::__cxx11::string::~string((string *)&local_40);
  missing_req_arg::missing_req_arg(__return_storage_ptr__,(missing_req_arg *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }